

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O1

void __thiscall
QDataWidgetMapperPrivate::closeEditor(QDataWidgetMapperPrivate *this,QWidget *w,EndEditHint hint)

{
  pointer pWVar1;
  int iVar2;
  ulong uVar3;
  code *UNRECOVERED_JUMPTABLE;
  ulong uVar4;
  undefined8 uVar5;
  
  iVar2 = findWidget(this,w);
  if (iVar2 == -1) {
    return;
  }
  if (hint == EditNextItem) {
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)w + 0x198);
    uVar5 = 1;
  }
  else {
    if (hint != EditPreviousItem) {
      if (hint != RevertModelCache) {
        return;
      }
      uVar3 = (ulong)iVar2;
      pWVar1 = (this->widgetMap).
               super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->widgetMap).
                     super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 3) *
              0x6db6db6db6db6db7;
      if (uVar4 < uVar3 || uVar4 - uVar3 == 0) {
        closeEditor();
      }
      populate(this,pWVar1 + uVar3);
      return;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)w + 0x198);
    uVar5 = 0;
  }
  (*UNRECOVERED_JUMPTABLE)(w,uVar5);
  return;
}

Assistant:

void QDataWidgetMapperPrivate::closeEditor(QWidget *w, QAbstractItemDelegate::EndEditHint hint)
{
    int idx = findWidget(w);
    if (idx == -1)
        return; // not our widget

    switch (hint) {
    case QAbstractItemDelegate::RevertModelCache: {
        populate(widgetMap[idx]);
        break; }
    case QAbstractItemDelegate::EditNextItem:
        w->focusNextChild();
        break;
    case QAbstractItemDelegate::EditPreviousItem:
        w->focusPreviousChild();
        break;
    case QAbstractItemDelegate::SubmitModelCache:
    case QAbstractItemDelegate::NoHint:
        // nothing
        break;
    }
}